

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_file.c
# Opt level: O2

lu_int lu_file_compress(lu_int nlines,lu_int *begin,lu_int *end,lu_int *next,lu_int *index,
                       double *value,double stretch,lu_int pad)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  lVar5 = (long)nlines;
  lVar3 = 0;
  iVar4 = 0;
  iVar8 = 0;
  lVar6 = lVar5;
  while( true ) {
    piVar1 = next + lVar6;
    lVar6 = (long)*piVar1;
    if (nlines <= *piVar1) break;
    iVar2 = begin[lVar6];
    lVar9 = (long)iVar2;
    iVar4 = iVar4 + (int)lVar3;
    if (iVar2 <= iVar4) {
      iVar4 = iVar2;
    }
    iVar7 = end[lVar6];
    begin[lVar6] = iVar4;
    lVar3 = (long)iVar4;
    for (; lVar9 < iVar7; lVar9 = lVar9 + 1) {
      index[lVar3] = index[lVar9];
      value[lVar3] = value[lVar9];
      lVar3 = lVar3 + 1;
    }
    end[lVar6] = (lu_int)lVar3;
    iVar7 = iVar7 - iVar2;
    iVar4 = (int)((double)iVar7 * stretch + (double)pad);
    iVar8 = iVar7 + iVar8;
  }
  iVar4 = iVar4 + (int)lVar3;
  if (begin[lVar5] <= iVar4) {
    iVar4 = begin[lVar5];
  }
  begin[lVar5] = iVar4;
  return iVar8;
}

Assistant:

lu_int lu_file_compress(
    lu_int nlines, lu_int *begin, lu_int *end, const lu_int *next,
    lu_int *index, double *value, double stretch, lu_int pad)
{
    lu_int i, pos, ibeg, iend, used, extra_space, nz = 0;

    used = 0; extra_space = 0;
    for (i = next[nlines]; i < nlines; i = next[i]) /* move line i */
    {
        ibeg = begin[i];
        iend = end[i];
        assert(ibeg >= used);
        used += extra_space;
        if (used > ibeg)
            used = ibeg;        /* chop extra space added before */
        begin[i] = used;
        for (pos = ibeg; pos < iend; pos++)
        {
            index[used] = index[pos];
            value[used++] = value[pos];
        }
        end[i] = used;
        extra_space = stretch*(iend-ibeg) + pad;
        nz += iend-ibeg;
    }
    assert(used <= begin[nlines]);
    used += extra_space;
    if (used > begin[nlines])
        used = begin[nlines];   /* never use more space than before */
    begin[nlines] = used;
    return nz;
}